

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_imm(m68k_info *info,int opcode,int data)

{
  MCInst_setOpcode(info->inst,opcode);
  (info->extension).op_count = '\x01';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  MCInst_setOpcode(info->inst,opcode);
  (info->extension).operands[0].type = M68K_OP_IMM;
  (info->extension).operands[0].address_mode = M68K_AM_IMMEDIATE;
  (info->extension).operands[0].field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)data;
  return;
}

Assistant:

static void build_imm(m68k_info *info, int opcode, int data)
{
	cs_m68k_op* op;
	cs_m68k* ext = build_init_op(info, opcode, 1, 0);

	MCInst_setOpcode(info->inst, opcode);

	op = &ext->operands[0];

	op->type = M68K_OP_IMM;
	op->address_mode = M68K_AM_IMMEDIATE;
	op->imm = data;
}